

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsbox.cpp
# Opt level: O2

void __thiscall
libsbox::Task::
deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
          (Task *this,Value *value)

{
  Task *pTVar1;
  bool bVar2;
  int iVar3;
  SizeType SVar4;
  ContextManager *pCVar5;
  Type pGVar6;
  int64_t iVar7;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar8;
  size_t i;
  ulong uVar9;
  allocator<char> local_81;
  BindRule local_80;
  Task *local_38;
  
  if ((value->data_).f.flags != 3) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"time_limit_ms");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"time_limit_ms");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"time_limit_ms");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->time_limit_ms_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"wall_time_limit_ms");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"wall_time_limit_ms");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"wall_time_limit_ms");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->wall_time_limit_ms_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"memory_limit_kb");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"memory_limit_kb");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"memory_limit_kb");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->memory_limit_kb_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"fsize_limit_kb");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"fsize_limit_kb");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x80000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"fsize_limit_kb");
  iVar7 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt64(pGVar6);
  this->fsize_limit_kb_ = iVar7;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"max_files");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"max_files");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"max_files");
  iVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar6);
  this->max_files_ = iVar3;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"max_threads");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"max_threads");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x20000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"max_threads");
  iVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetInt(pGVar6);
  this->max_threads_ = iVar3;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"need_ipc");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"need_ipc");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x8000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"need_ipc");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetBool(pGVar6);
  this->need_ipc_ = bVar2;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"use_standard_binds");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"use_standard_binds");
  if ((undefined1  [16])((undefined1  [16])pGVar6->data_ & (undefined1  [16])0x8000000000000) ==
      (undefined1  [16])0x0) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"use_standard_binds");
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetBool(pGVar6);
  this->use_standard_binds_ = bVar2;
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"stdin");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"stdin");
  Stream::
  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&this->stdin_,pGVar6);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"stdout");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"stdout");
  Stream::
  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&this->stdout_,pGVar6);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"stderr");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"stderr");
  Stream::
  deserialize_request<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
            (&(this->stderr_).super_Stream,pGVar6);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"argv");
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"argv");
  if ((pGVar6->data_).f.flags != 4) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  local_38 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->argv_);
  uVar9 = 0;
  while( true ) {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"argv");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (SVar4 <= uVar9) break;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"argv");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar9);
    if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pCVar5 = ContextManager::get();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"JSON is incorrect",&local_81);
      (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"argv");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar9);
    local_80.inside_._M_dataplus._M_p =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(pGVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->argv_,
               (char **)&local_80);
    uVar9 = uVar9 + 1;
  }
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"env");
  pTVar1 = local_38;
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"env");
  if ((pGVar6->data_).f.flags != 4) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&pTVar1->env_);
  uVar9 = 0;
  while( true ) {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"env");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (SVar4 <= uVar9) break;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"env");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar9);
    if ((undefined1  [16])((undefined1  [16])pGVar8->data_ & (undefined1  [16])0x400000000000000) ==
        (undefined1  [16])0x0) {
      pCVar5 = ContextManager::get();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"JSON is incorrect",&local_81);
      (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"env");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar9);
    local_80.inside_._M_dataplus._M_p =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::GetString(pGVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pTVar1->env_,
               (char **)&local_80);
    uVar9 = uVar9 + 1;
  }
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(value,"binds");
  pTVar1 = local_38;
  if (!bVar2) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pGVar6 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)value,"binds");
  if ((pGVar6->data_).f.flags != 4) {
    pCVar5 = ContextManager::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"JSON is incorrect",&local_81);
    (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>::clear(&pTVar1->binds_);
  uVar9 = 0;
  while( true ) {
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"binds");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Size(pGVar6);
    if (SVar4 <= uVar9) break;
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"binds");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar9);
    if ((pGVar8->data_).f.flags != 3) {
      pCVar5 = ContextManager::get();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"JSON is incorrect",&local_81);
      (**pCVar5->_vptr_ContextManager)(pCVar5,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    pGVar6 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)value,"binds");
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::operator[](pGVar6,(SizeType)uVar9);
    BindRule::
    BindRule<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&local_80,pGVar8);
    std::vector<libsbox::BindRule,_std::allocator<libsbox::BindRule>_>::
    emplace_back<libsbox::BindRule>(&pTVar1->binds_,&local_80);
    BindRule::~BindRule(&local_80);
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void Task::deserialize_request(const rapidjson::Value &value) {
    CHECK_TYPE(value, Object);
    GET_MEMBER(time_limit_ms_, value, "time_limit_ms", Int64);
    GET_MEMBER(wall_time_limit_ms_, value, "wall_time_limit_ms", Int64);
    GET_MEMBER(memory_limit_kb_, value, "memory_limit_kb", Int64);
    GET_MEMBER(fsize_limit_kb_, value, "fsize_limit_kb", Int64);
    GET_MEMBER(max_files_, value, "max_files", Int);
    GET_MEMBER(max_threads_, value, "max_threads", Int);
    GET_MEMBER(need_ipc_, value, "need_ipc", Bool);
    GET_MEMBER(use_standard_binds_, value, "use_standard_binds", Bool);
    CHECK_MEMBER(value, "stdin");
    stdin_.deserialize_request(value["stdin"]);
    CHECK_MEMBER(value, "stdout");
    stdout_.deserialize_request(value["stdout"]);
    CHECK_MEMBER(value, "stderr");
    stderr_.deserialize_request(value["stderr"]);
    CHECK_MEMBER(value, "argv");
    CHECK_TYPE(value["argv"], Array);
    argv_.clear();
    for (size_t i = 0; i < value["argv"].Size(); ++i) {
        CHECK_TYPE(value["argv"][i], String);
        argv_.emplace_back(value["argv"][i].GetString());
    }
    CHECK_MEMBER(value, "env");
    CHECK_TYPE(value["env"], Array);
    env_.clear();
    for (size_t i = 0; i < value["env"].Size(); ++i) {
        CHECK_TYPE(value["env"][i], String);
        env_.emplace_back(value["env"][i].GetString());
    }
    CHECK_MEMBER(value, "binds");
    CHECK_TYPE(value["binds"], Array);
    binds_.clear();
    for (size_t i = 0; i < value["binds"].Size(); ++i) {
        CHECK_TYPE(value["binds"][i], Object);
        binds_.push_back(BindRule(value["binds"][i]));
    }
}